

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_formparse.c
# Opt level: O3

int formparse(Configurable *config,char *input,curl_httppost **httppost,curl_httppost **last_post,
             _Bool literal_value)

{
  Configurable *config_00;
  int iVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  ushort **ppuVar5;
  size_t sVar6;
  size_t sVar7;
  char *pcVar8;
  multi_files *pmVar9;
  char *pcVar10;
  void *__ptr;
  ulong uVar11;
  char cVar12;
  long lVar13;
  char *pcVar14;
  multi_files **multi_first;
  uint uVar15;
  uint uVar16;
  char *pcVar17;
  bool bVar18;
  multi_files *multi_start;
  multi_files *multi_current;
  char type_major [128];
  char type_minor [128];
  char name [256];
  multi_files *local_278;
  multi_files *local_270;
  char *local_268;
  Configurable *local_260;
  curl_httppost **local_258;
  curl_httppost **local_250;
  char *local_248;
  char *local_240;
  char local_238 [8];
  undefined1 *local_230;
  undefined4 local_228 [2];
  char *local_220;
  char local_1b8 [128];
  undefined1 local_138 [264];
  
  local_250 = httppost;
  iVar1 = __isoc99_sscanf(input,"%255[^=]=",local_138);
  if ((iVar1 != 1) || (pcVar3 = strchr(input,0x3d), pcVar3 == (char *)0x0)) {
    warnf(config,"Illegally formatted input field!\n");
    return 1;
  }
  local_258 = last_post;
  pcVar3 = strdup(pcVar3 + 1);
  if (pcVar3 == (char *)0x0) {
    curl_mfprintf(config->errors,"out of memory\n");
    return 1;
  }
  cVar12 = *pcVar3;
  if (cVar12 == '@' && !literal_value) {
    local_278 = (multi_files *)0x0;
    local_270 = (multi_files *)0x0;
    pcVar10 = pcVar3 + 1;
    local_268 = pcVar3;
    local_260 = config;
    do {
      pcVar4 = strchr(pcVar10,0x3b);
      local_240 = pcVar10;
      pcVar10 = strchr(pcVar10,0x2c);
      pcVar3 = pcVar4;
      if (pcVar10 < pcVar4) {
        pcVar3 = pcVar10;
      }
      if (pcVar10 == (char *)0x0) {
        pcVar3 = pcVar4;
      }
      if (pcVar3 == (char *)0x0) {
        pcVar10 = (char *)0x0;
LAB_00109338:
        pcVar3 = (char *)0x0;
        pcVar4 = (char *)0x0;
      }
      else {
        pcVar10 = pcVar3 + 1;
        cVar12 = *pcVar3;
        *pcVar3 = '\0';
        if (cVar12 != ';') goto LAB_00109338;
        pcVar4 = (char *)0x0;
        pcVar3 = (char *)0x0;
        do {
          if (*pcVar10 == ',') break;
          ppuVar5 = __ctype_b_loc();
          pcVar8 = pcVar10;
          pcVar10 = pcVar10 + -1;
          do {
            pcVar17 = pcVar10;
            pcVar14 = pcVar8;
            pcVar10 = pcVar17 + 1;
            pcVar8 = pcVar14 + 1;
          } while ((*(byte *)((long)*ppuVar5 + (ulong)(byte)pcVar17[1] * 2 + 1) & 0x20) != 0);
          iVar1 = Curl_raw_nequal("type=",pcVar10,5);
          if (iVar1 == 0) {
            iVar1 = Curl_raw_nequal("filename=",pcVar10,9);
            if (iVar1 == 0) break;
            pcVar4 = pcVar17 + 10;
            pcVar8 = strchr(pcVar4,0x3b);
            bVar18 = true;
            if ((pcVar8 == (char *)0x0) && (pcVar8 = strchr(pcVar4,0x2c), pcVar8 == (char *)0x0)) {
              pcVar4 = pcVar14 + 9;
              goto LAB_00109386;
            }
          }
          else {
            pcVar3 = pcVar17 + 6;
            local_248 = pcVar4;
            iVar1 = __isoc99_sscanf(pcVar3,"%127[^/]/%127[^;,\n]",local_238,local_1b8);
            if (iVar1 != 2) {
              warnf(local_260,"Illegally formatted content-type field!\n");
              free(local_268);
              FreeMultiInfo(&local_278,&local_270);
              return 2;
            }
            sVar6 = strlen(local_238);
            sVar7 = strlen(local_1b8);
            lVar13 = sVar7 + sVar6;
            pcVar4 = pcVar10 + lVar13 + 6;
            cVar12 = *pcVar4;
            bVar18 = cVar12 == ';';
            pcVar8 = pcVar4;
            if (bVar18) {
              iVar1 = Curl_raw_nequal(";filename=",pcVar4,10);
              if ((iVar1 == 0) &&
                 (pcVar8 = strchr(pcVar10 + lVar13 + 7,0x3b), pcVar8 == (char *)0x0)) {
                sVar6 = strlen(pcVar4);
                pcVar8 = pcVar10 + sVar6 + lVar13 + 6;
              }
              cVar12 = *pcVar8;
            }
            pcVar4 = local_248;
            if (cVar12 == '\0') {
              pcVar3 = pcVar14 + 5;
LAB_00109386:
              pcVar10 = (char *)0x0;
              break;
            }
          }
          *pcVar8 = '\0';
          pcVar10 = pcVar8 + 1;
        } while (bVar18);
      }
      multi_first = &local_278;
      pmVar9 = AddMultiFiles(local_240,pcVar3,pcVar4,multi_first,&local_270);
      if (pmVar9 == (multi_files *)0x0) {
        warnf(local_260,"Error building form post!\n");
        free(local_268);
        FreeMultiInfo(&local_278,&local_270);
        return 3;
      }
    } while ((pcVar10 != (char *)0x0) && (*pcVar10 != '\0'));
    pcVar3 = local_268;
    if (local_278 != (multi_files *)0x0) {
      pmVar9 = local_278;
      uVar16 = 0;
      do {
        uVar15 = uVar16;
        pmVar9 = pmVar9->next;
        uVar16 = uVar15 + 1;
      } while (pmVar9 != (multi_files *)0x0);
      __ptr = malloc((ulong)(uVar15 + 2) << 4);
      config_00 = local_260;
      pcVar3 = local_268;
      if (__ptr == (void *)0x0) {
        curl_mfprintf(local_260->errors,"Error building form post!\n");
        free(pcVar3);
        FreeMultiInfo(&local_278,&local_270);
        return 4;
      }
      if (uVar16 != 0) {
        lVar13 = 0;
        do {
          pmVar9 = *multi_first;
          *(CURLformoption *)((long)__ptr + lVar13) = (pmVar9->form).option;
          *(char **)((long)__ptr + lVar13 + 8) = (pmVar9->form).value;
          multi_first = &pmVar9->next;
          lVar13 = lVar13 + 0x10;
        } while ((ulong)uVar16 << 4 != lVar13);
      }
      *(undefined4 *)((long)__ptr + (ulong)uVar16 * 0x10) = 0x11;
      FreeMultiInfo(&local_278,&local_270);
      iVar1 = curl_formadd(local_250,local_258,1,local_138,8,__ptr,0x11);
      if (iVar1 != 0) {
        warnf(config_00,"curl_formadd failed!\n");
        free(__ptr);
        free(pcVar3);
        return 5;
      }
      free(__ptr);
      pcVar3 = local_268;
    }
  }
  else {
    local_230 = local_138;
    if (literal_value) {
      iVar1 = 1;
    }
    else {
      pcVar10 = strstr(pcVar3,";type=");
      local_238[0] = '\x01';
      local_238[1] = '\0';
      local_238[2] = '\0';
      local_238[3] = '\0';
      if (pcVar10 == (char *)0x0) {
        iVar1 = 1;
      }
      else {
        local_228[0] = 0xe;
        local_220 = pcVar10 + 6;
        *pcVar10 = '\0';
        cVar12 = *pcVar3;
        iVar1 = 2;
      }
      if (cVar12 == '<') {
        uVar11 = (ulong)(uint)(iVar1 << 4);
        pcVar10 = local_238 + uVar11;
        pcVar10[0] = '\a';
        pcVar10[1] = '\0';
        pcVar10[2] = '\0';
        pcVar10[3] = '\0';
        *(char **)((long)local_228 + (uVar11 - 8)) = pcVar3 + 1;
        *(undefined4 *)((long)local_228 + uVar11) = 0x11;
        iVar1 = curl_formadd(local_250,local_258,8,local_238,0x11);
        if (iVar1 == 0) goto LAB_00109654;
        warnf(config,"curl_formadd failed, possibly the file %s is bad!\n",pcVar3 + 1);
        iVar1 = 6;
        goto LAB_00109603;
      }
    }
    local_238[0] = '\x01';
    local_238[1] = '\0';
    local_238[2] = '\0';
    local_238[3] = '\0';
    uVar11 = (ulong)(uint)(iVar1 << 4);
    pcVar10 = local_238 + uVar11;
    pcVar10[0] = '\x04';
    pcVar10[1] = '\0';
    pcVar10[2] = '\0';
    pcVar10[3] = '\0';
    *(char **)((long)local_228 + (uVar11 - 8)) = pcVar3;
    *(undefined4 *)((long)local_228 + uVar11) = 0x11;
    iVar1 = 8;
    iVar2 = curl_formadd(local_250,local_258,8,local_238,0x11);
    if (iVar2 != 0) {
      warnf(config,"curl_formadd failed!\n");
LAB_00109603:
      free(pcVar3);
      return iVar1;
    }
  }
LAB_00109654:
  free(pcVar3);
  return 0;
}

Assistant:

int formparse(struct Configurable *config,
              const char *input,
              struct curl_httppost **httppost,
              struct curl_httppost **last_post,
              bool literal_value)
{
  /* nextarg MUST be a string in the format 'name=contents' and we'll
     build a linked list with the info */
  char name[256];
  char *contents = NULL;
  char type_major[128];
  char type_minor[128];
  char *contp;
  const char *type = NULL;
  char *sep;
  char *sep2;

  if((1 == sscanf(input, "%255[^=]=", name)) &&
     ((contp = strchr(input, '=')) != NULL)) {
    /* the input was using the correct format */

    /* Allocate the contents */
    contents = strdup(contp+1);
    if(!contents) {
      fprintf(config->errors, "out of memory\n");
      return 1;
    }
    contp = contents;

    if('@' == contp[0] && !literal_value) {

      /* we use the @-letter to indicate file name(s) */

      struct multi_files *multi_start = NULL;
      struct multi_files *multi_current = NULL;

      contp++;

      do {
        /* since this was a file, it may have a content-type specifier
           at the end too, or a filename. Or both. */
        char *ptr;
        char *filename = NULL;

        sep = strchr(contp, ';');
        sep2 = strchr(contp, ',');

        /* pick the closest */
        if(sep2 && (sep2 < sep)) {
          sep = sep2;

          /* no type was specified! */
        }

        type = NULL;

        if(sep) {
          bool semicolon = (';' == *sep) ? TRUE : FALSE;

          *sep = '\0'; /* terminate file name at separator */

          ptr = sep+1; /* point to the text following the separator */

          while(semicolon && ptr && (','!= *ptr)) {

            /* pass all white spaces */
            while(ISSPACE(*ptr))
              ptr++;

            if(checkprefix("type=", ptr)) {
              /* set type pointer */
              type = &ptr[5];

              /* verify that this is a fine type specifier */
              if(2 != sscanf(type, "%127[^/]/%127[^;,\n]",
                             type_major, type_minor)) {
                warnf(config, "Illegally formatted content-type field!\n");
                Curl_safefree(contents);
                FreeMultiInfo(&multi_start, &multi_current);
                return 2; /* illegal content-type syntax! */
              }

              /* now point beyond the content-type specifier */
              sep = (char *)type + strlen(type_major)+strlen(type_minor)+1;

              /* there's a semicolon following - we check if it is a filename
                 specified and if not we simply assume that it is text that
                 the user wants included in the type and include that too up
                 to the next zero or semicolon. */
              if(*sep==';') {
                if(!checkprefix(";filename=", sep)) {
                  sep2 = strchr(sep+1, ';');
                  if(sep2)
                    sep = sep2;
                  else
                    sep = sep + strlen(sep); /* point to end of string */
                }
              }
              else
                semicolon = FALSE;

              if(*sep) {
                *sep = '\0'; /* zero terminate type string */

                ptr = sep+1;
              }
              else
                ptr = NULL; /* end */
            }
            else if(checkprefix("filename=", ptr)) {
              filename = &ptr[9];
              ptr = strchr(filename, ';');
              if(!ptr) {
                ptr = strchr(filename, ',');
              }
              if(ptr) {
                *ptr = '\0'; /* zero terminate */
                ptr++;
              }
            }
            else
              /* confusion, bail out of loop */
              break;
          }

          sep = ptr;
        }

        /* if type == NULL curl_formadd takes care of the problem */

        if(!AddMultiFiles(contp, type, filename, &multi_start,
                          &multi_current)) {
          warnf(config, "Error building form post!\n");
          Curl_safefree(contents);
          FreeMultiInfo(&multi_start, &multi_current);
          return 3;
        }
        contp = sep; /* move the contents pointer to after the separator */

      } while(sep && *sep); /* loop if there's another file name */

      /* now we add the multiple files section */
      if(multi_start) {
        struct curl_forms *forms = NULL;
        struct multi_files *ptr = multi_start;
        unsigned int i, count = 0;
        while(ptr) {
          ptr = ptr->next;
          ++count;
        }
        forms = malloc((count+1)*sizeof(struct curl_forms));
        if(!forms) {
          fprintf(config->errors, "Error building form post!\n");
          Curl_safefree(contents);
          FreeMultiInfo(&multi_start, &multi_current);
          return 4;
        }
        for(i = 0, ptr = multi_start; i < count; ++i, ptr = ptr->next) {
          forms[i].option = ptr->form.option;
          forms[i].value = ptr->form.value;
        }
        forms[count].option = CURLFORM_END;
        FreeMultiInfo(&multi_start, &multi_current);
        if(curl_formadd(httppost, last_post,
                        CURLFORM_COPYNAME, name,
                        CURLFORM_ARRAY, forms, CURLFORM_END) != 0) {
          warnf(config, "curl_formadd failed!\n");
          Curl_safefree(forms);
          Curl_safefree(contents);
          return 5;
        }
        Curl_safefree(forms);
      }
    }
    else {
      struct curl_forms info[4];
      int i = 0;
      char *ct = literal_value ? NULL : strstr(contp, ";type=");

      info[i].option = CURLFORM_COPYNAME;
      info[i].value = name;
      i++;

      if(ct) {
        info[i].option = CURLFORM_CONTENTTYPE;
        info[i].value = &ct[6];
        i++;
        ct[0] = '\0'; /* zero terminate here */
      }

      if(contp[0]=='<' && !literal_value) {
        info[i].option = CURLFORM_FILECONTENT;
        info[i].value = contp+1;
        i++;
        info[i].option = CURLFORM_END;

        if(curl_formadd(httppost, last_post,
                        CURLFORM_ARRAY, info, CURLFORM_END ) != 0) {
          warnf(config, "curl_formadd failed, possibly the file %s is bad!\n",
                contp+1);
          Curl_safefree(contents);
          return 6;
        }
      }
      else {
#ifdef CURL_DOES_CONVERSIONS
        if(convert_to_network(contp, strlen(contp))) {
          warnf(config, "curl_formadd failed!\n");
          Curl_safefree(contents);
          return 7;
        }
#endif
        info[i].option = CURLFORM_COPYCONTENTS;
        info[i].value = contp;
        i++;
        info[i].option = CURLFORM_END;
        if(curl_formadd(httppost, last_post,
                        CURLFORM_ARRAY, info, CURLFORM_END) != 0) {
          warnf(config, "curl_formadd failed!\n");
          Curl_safefree(contents);
          return 8;
        }
      }
    }

  }
  else {
    warnf(config, "Illegally formatted input field!\n");
    return 1;
  }
  Curl_safefree(contents);
  return 0;
}